

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_number_toPrecision(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue val_00;
  JSValue val_01;
  JSValue val_02;
  int iVar1;
  JSContext *in_RDI;
  JSValue *in_R8;
  JSValue JVar2;
  int in_stack_0000000c;
  int in_stack_00000010;
  int in_stack_00000014;
  double in_stack_00000018;
  JSContext *in_stack_00000020;
  double d;
  int p;
  JSValue val;
  JSContext *in_stack_ffffffffffffff80;
  JSValueUnion in_stack_ffffffffffffff88;
  JSValueUnion in_stack_ffffffffffffff90;
  JSValueUnion pres;
  JSContext *ctx_00;
  double in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  JSValueUnion local_10;
  int64_t local_8;
  
  JVar2.tag = (int64_t)in_stack_ffffffffffffff90.ptr;
  JVar2.u.ptr = in_stack_ffffffffffffff88.ptr;
  JVar2 = js_thisNumberValue(in_stack_ffffffffffffff80,JVar2);
  pres = JVar2.u;
  ctx_00 = (JSContext *)JVar2.tag;
  iVar1 = JS_IsException(JVar2);
  if (iVar1 == 0) {
    val_00.tag = (int64_t)pres.ptr;
    val_00.u.ptr = in_stack_ffffffffffffff90.ptr;
    iVar1 = JS_ToFloat64Free((JSContext *)in_stack_ffffffffffffff88.ptr,
                             (double *)in_stack_ffffffffffffff80,val_00);
    if (iVar1 == 0) {
      iVar1 = JS_IsUndefined(*in_R8);
      if (iVar1 == 0) {
        val_02.tag._0_4_ = in_stack_ffffffffffffffb0;
        val_02.u.float64 = in_stack_ffffffffffffffa8;
        val_02.tag._4_4_ = in_stack_ffffffffffffffb4;
        iVar1 = JS_ToInt32Sat(ctx_00,(int *)pres.ptr,val_02);
        if (iVar1 != 0) {
          local_10.ptr = (void *)(local_10 << 0x20);
          local_8 = 6;
          return _local_10;
        }
        if ((ulong)ABS(in_stack_ffffffffffffffa8) < 0x7ff0000000000000) {
          if ((0 < in_stack_ffffffffffffffb4) && (in_stack_ffffffffffffffb4 < 0x65)) {
            JVar2 = js_dtoa(in_stack_00000020,in_stack_00000018,in_stack_00000014,in_stack_00000010,
                            in_stack_0000000c);
            return JVar2;
          }
          JVar2 = JS_ThrowRangeError(in_RDI,"invalid number of digits");
          return JVar2;
        }
      }
      JVar2 = __JS_NewFloat64(in_RDI,in_stack_ffffffffffffffa8);
      val_01.tag = (int64_t)pres.ptr;
      val_01.u = (JSValueUnion)(JSValueUnion)JVar2.tag;
      JVar2 = JS_ToStringFree((JSContext *)JVar2.u.ptr,val_01);
    }
    else {
      local_10.ptr = (void *)(local_10 << 0x20);
      local_8 = 6;
      JVar2 = _local_10;
    }
  }
  _local_10 = JVar2;
  return _local_10;
}

Assistant:

static JSValue js_number_toPrecision(JSContext *ctx, JSValueConst this_val,
                                     int argc, JSValueConst *argv)
{
    JSValue val;
    int p;
    double d;

    val = js_thisNumberValue(ctx, this_val);
    if (JS_IsException(val))
        return val;
    if (JS_ToFloat64Free(ctx, &d, val))
        return JS_EXCEPTION;
    if (JS_IsUndefined(argv[0]))
        goto to_string;
    if (JS_ToInt32Sat(ctx, &p, argv[0]))
        return JS_EXCEPTION;
    if (!isfinite(d)) {
    to_string:
        return JS_ToStringFree(ctx,  __JS_NewFloat64(ctx, d));
    }
    if (p < 1 || p > 100)
        return JS_ThrowRangeError(ctx, "invalid number of digits");
    return js_dtoa(ctx, d, 10, p, JS_DTOA_FIXED_FORMAT);
}